

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

tmbstr ParseValue(TidyDocImpl *doc,ctmbstr name,Bool foldCase,Bool *isempty,int *pdelim)

{
  Lexer *lexer;
  Lexer *lexer_00;
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Bool BVar8;
  int iVar9;
  int iVar10;
  tmbstr ptVar11;
  byte *pbVar12;
  byte bVar13;
  ulong uVar14;
  uint uVar15;
  StreamIn *in;
  long lVar16;
  uint local_54;
  
  lexer = doc->lexer;
  *pdelim = 0x22;
  iVar10 = *(int *)((doc->config).value + 0x2c);
  do {
    uVar3 = prvTidyReadChar(doc->docIn);
    if (uVar3 == 0xffffffff) {
      prvTidyUngetChar(0xffffffff,doc->docIn);
      goto LAB_0014788c;
    }
  } while ((uVar3 < 0x80) && ((lexmap[uVar3] & 8) != 0));
  if ((0x3d < uVar3) || ((0x2000008400000000U >> ((ulong)uVar3 & 0x3f) & 1) == 0)) {
LAB_0014788c:
    prvTidyUngetChar(uVar3,doc->docIn);
    return (tmbstr)0x0;
  }
  do {
    uVar3 = prvTidyReadChar(doc->docIn);
    if (uVar3 == 0xffffffff) {
      prvTidyUngetChar(0xffffffff,doc->docIn);
      goto LAB_001478b2;
    }
  } while ((uVar3 < 0x80) && ((lexmap[uVar3] & 8) != 0));
  if ((uVar3 != 0x22) && (uVar3 != 0x27)) {
    if (uVar3 == 0x3c) {
      uVar3 = lexer->lexsize;
      prvTidyAddCharToLexer(lexer,0x3c);
      lexer_00 = doc->lexer;
      uVar4 = prvTidyReadChar(doc->docIn);
      prvTidyAddCharToLexer(lexer_00,uVar4);
      iVar10 = 0x22;
      uVar15 = uVar4 - 0x25;
      do {
        uVar4 = prvTidyReadChar(doc->docIn);
        if (uVar4 == 0xffffffff) {
LAB_00147bb8:
          *pdelim = iVar10;
          uVar4 = lexer->lexsize - uVar3;
          lexer->lexsize = uVar3;
          if ((int)uVar4 < 1) {
            return (tmbstr)0x0;
          }
          ptVar11 = prvTidytmbstrndup(doc->allocator,lexer->lexbuf + (int)uVar3,uVar4);
          return ptVar11;
        }
        if (uVar4 == 0x3e) {
          if ((uVar15 < 0x1c) && ((0xc000001U >> (uVar15 & 0x1f) & 1) != 0)) {
            prvTidyAddCharToLexer(lexer_00,0x3e);
          }
          else {
            prvTidyUngetChar(0x3e,doc->docIn);
          }
          goto LAB_00147bb8;
        }
        if ((((0x1b < uVar15) || ((0xc000001U >> (uVar15 & 0x1f) & 1) == 0)) && (uVar4 < 0x80)) &&
           ((lexmap[uVar4] & 8) != 0)) goto LAB_00147bb8;
        prvTidyAddCharToLexer(lexer_00,uVar4);
        if (uVar4 == 0x27) {
          do {
            uVar4 = prvTidyReadChar(doc->docIn);
            if (uVar4 == 0x3e) goto LAB_00147b8c;
            if (uVar4 == 0xffffffff) goto LAB_00147b63;
            prvTidyAddCharToLexer(lexer_00,uVar4);
          } while (uVar4 != 0x27);
        }
        else if (uVar4 == 0x22) {
          do {
            uVar4 = prvTidyReadChar(doc->docIn);
            if (uVar4 == 0x3e) goto LAB_00147b8c;
            if (uVar4 == 0xffffffff) goto LAB_00147b63;
            prvTidyAddCharToLexer(lexer_00,uVar4);
            iVar10 = 0x27;
          } while (uVar4 != 0x22);
        }
      } while( true );
    }
LAB_001478b2:
    prvTidyUngetChar(uVar3,doc->docIn);
    uVar3 = 0;
  }
  local_54 = lexer->lexsize;
  uVar4 = prvTidyReadChar(doc->docIn);
  if (uVar4 != 0xffffffff) {
    uVar15 = 0;
    uVar7 = 0;
    bVar1 = false;
LAB_001478ef:
    if (uVar3 == 0) {
      if (0x2e < (int)uVar4) {
        if (uVar4 != 0x2f) {
          if (uVar4 != 0x3c) {
            if (uVar4 == 0x3e) goto LAB_00147c8d;
            goto LAB_001479d7;
          }
          prvTidyUngetChar(0x3c,doc->docIn);
          prvTidyUngetChar(0x3e,doc->docIn);
          prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x289);
          goto LAB_00147ca3;
        }
        uVar4 = prvTidyReadChar(doc->docIn);
        if ((uVar4 == 0x3e) && (BVar8 = prvTidyIsUrl(doc,name), BVar8 == no)) {
          *isempty = yes;
LAB_00147c8d:
          prvTidyUngetChar(0x3e,doc->docIn);
          goto LAB_00147ca3;
        }
        prvTidyUngetChar(uVar4,doc->docIn);
        if ((lexmap[0x2f] & 8) != 0) goto LAB_00147ca3;
        uVar4 = 0x2f;
        uVar7 = lexmap[0x2f];
        if (foldCase == no) goto LAB_00147a89;
LAB_00147a70:
        uVar4 = uVar4 + (uVar7 >> 1 & 0x20);
LAB_00147a89:
        prvTidyAddCharToLexer(lexer,uVar4);
        uVar7 = uVar4;
        goto LAB_00147a98;
      }
      if ((uVar4 != 0x22) && (uVar4 != 0x27)) goto LAB_001479d7;
      uVar6 = prvTidyReadChar(doc->docIn);
      if (uVar6 == 0x3e) {
        prvTidyAddCharToLexer(lexer,uVar4);
        in = doc->docIn;
        uVar4 = 0x3e;
        goto LAB_00147b59;
      }
      prvTidyUngetChar(uVar6,doc->docIn);
    }
    else {
      if (uVar4 == uVar3) goto LAB_00147ca3;
      if ((uVar4 < 0x3f) && ((0x5000000000000400U >> ((ulong)uVar4 & 0x3f) & 1) != 0)) {
        uVar15 = uVar15 + 1;
      }
      if (uVar4 == 0x3e) {
        bVar1 = true;
      }
    }
LAB_001479d7:
    if (uVar4 != 0x5c) {
      if (uVar4 == 0x26) {
        uVar7 = 0x26;
        prvTidyAddCharToLexer(lexer,0x26);
        ParseEntity(doc,IgnoreWhitespace);
        uVar5 = lexer->lexsize - 1;
        if (((iVar10 == 0) && (lexer->lexsize != 0)) && (lexer->lexbuf[uVar5] == '\n')) {
          lexer->lexbuf[uVar5] = ' ';
        }
        goto LAB_00147a98;
      }
      if (uVar4 < 0x80) goto LAB_00147a5c;
      goto LAB_00147a89;
    }
    uVar6 = prvTidyReadChar(doc->docIn);
    uVar4 = 10;
    if (uVar6 != 10) {
      prvTidyUngetChar(uVar6,doc->docIn);
      uVar4 = 0x5c;
    }
LAB_00147a5c:
    if ((lexmap[uVar4] & 8) == 0) {
      if (foldCase != no) {
        uVar7 = lexmap[uVar4];
        goto LAB_00147a70;
      }
      goto LAB_00147a89;
    }
    if (uVar3 == 0) goto LAB_00147ca3;
    if (iVar10 != 0) goto LAB_00147a89;
    if ((uVar4 == 10) && (BVar8 = prvTidyIsUrl(doc,name), BVar8 != no)) {
      prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x266);
      uVar7 = 10;
    }
    else {
      uVar4 = 0x20;
      if (uVar7 != 0x20) goto LAB_00147a89;
      BVar8 = prvTidyIsUrl(doc,name);
      uVar7 = 0x20;
      if (BVar8 != no) {
        prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x290);
      }
    }
LAB_00147a98:
    uVar4 = prvTidyReadChar(doc->docIn);
    if (uVar4 == 0xffffffff) goto LAB_00147b35;
    goto LAB_001478ef;
  }
  bVar1 = false;
  uVar15 = 0;
LAB_00147b35:
  prvTidyReportAttrError(doc,lexer->token,(AttVal *)0x0,0x283);
  in = doc->docIn;
  uVar4 = 0xffffffff;
LAB_00147b59:
  prvTidyUngetChar(uVar4,in);
LAB_00147ca3:
  lVar16 = (long)(int)local_54;
  if ((((iVar10 == 0) && (10 < uVar15)) &&
      ((bVar1 && (BVar8 = prvTidyIsScript(doc,name), BVar8 == no)))) &&
     (((BVar8 = prvTidyIsUrl(doc,name), BVar8 == no ||
       (iVar9 = prvTidytmbstrncmp(lexer->lexbuf + lVar16,"javascript:",0xb), iVar9 != 0)) &&
      (iVar9 = prvTidytmbstrncmp(lexer->lexbuf + lVar16,"<xml ",5), iVar9 != 0)))) {
    prvTidyReport(doc,(Node *)0x0,(Node *)0x0,0x27d);
  }
  uVar15 = lexer->lexsize - local_54;
  uVar14 = (ulong)uVar15;
  lexer->lexsize = local_54;
  if ((uVar3 == 0) && ((int)uVar15 < 1)) {
    ptVar11 = (tmbstr)0x0;
    goto LAB_00147e3d;
  }
  if (((iVar10 == 0) && (0 < (int)uVar15)) &&
     ((iVar10 = prvTidytmbstrcasecmp(name,"alt"), iVar10 != 0 &&
      (((iVar10 = prvTidytmbstrcasecmp(name,"title"), iVar10 != 0 &&
        (iVar10 = prvTidytmbstrcasecmp(name,"value"), iVar10 != 0)) &&
       (iVar10 = prvTidytmbstrcasecmp(name,"prompt"), iVar10 != 0)))))) {
    ptVar11 = lexer->lexbuf;
    uVar2 = (ulong)uVar15;
    do {
      uVar14 = uVar2;
      if (((long)ptVar11[uVar14 + lVar16 + -1] < 0) || (uVar14 == 0)) break;
      uVar2 = uVar14 - 1;
    } while ((lexmap[ptVar11[uVar14 + lVar16 + -1]] & 8) != 0);
    bVar13 = ptVar11[lVar16];
    if ((char)bVar13 < '\0') goto LAB_00147e1c;
    pbVar12 = (byte *)(ptVar11 + lVar16);
    do {
      uVar4 = (uint)uVar14;
      pbVar12 = pbVar12 + 1;
      if (((lexmap[bVar13] & 8) == 0) || ((int)uVar4 < 1)) break;
      local_54 = local_54 + 1;
      uVar4 = uVar4 - 1;
      uVar14 = (ulong)uVar4;
      bVar13 = *pbVar12;
    } while (-1 < (char)bVar13);
  }
  else {
LAB_00147e1c:
    uVar4 = (uint)uVar14;
  }
  ptVar11 = prvTidytmbstrndup(doc->allocator,lexer->lexbuf + (int)local_54,uVar4);
LAB_00147e3d:
  *pdelim = uVar3;
  return ptVar11;
LAB_00147b8c:
  prvTidyUngetChar(0x3e,doc->docIn);
  iVar10 = 0;
  prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x289);
  goto LAB_00147bb8;
LAB_00147b63:
  iVar10 = 0;
  prvTidyReportAttrError(doc,lexer_00->token,(AttVal *)0x0,0x283);
  prvTidyUngetChar(0xffffffff,doc->docIn);
  goto LAB_00147bb8;
}

Assistant:

static tmbstr ParseValue( TidyDocImpl* doc, ctmbstr name,
                          Bool foldCase, Bool *isempty, int *pdelim)
{
    Lexer* lexer = doc->lexer;
    int len = 0, start;
    Bool seen_gt = no;
    Bool munge = yes;
    uint c, lastc, delim, quotewarning;
    tmbstr value;

    delim = (tmbchar) 0;
    *pdelim = '"';

    /*
     Henry Zrepa reports that some folk are using the
     embed element with script attributes where newlines
     are significant and must be preserved
    */
    if ( cfgBool(doc, TidyLiteralAttribs) )
        munge = no;

 /* skip white space before the '=' */

    for (;;)
    {
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (!TY_(IsWhite)(c))
           break;
    }

/*
  c should be '=' if there is a value
  other legal possibilities are white
  space, '/' and '>'
*/

    if (c != '=' && c != '"' && c != '\'')
    {
        TY_(UngetChar)(c, doc->docIn);
        return NULL;
    }

 /* skip white space after '=' */

    for (;;)
    {
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (!TY_(IsWhite)(c))
           break;
    }

 /* check for quote marks */

    if (c == '"' || c == '\'')
        delim = c;
    else if (c == '<')
    {
        start = lexer->lexsize;
        TY_(AddCharToLexer)(lexer, c);
        *pdelim = ParseServerInstruction( doc );
        len = lexer->lexsize - start;
        lexer->lexsize = start;
        return (len > 0 ? TY_(tmbstrndup)(doc->allocator,
                                          lexer->lexbuf+start, len) : NULL);
    }
    else
        TY_(UngetChar)(c, doc->docIn);

 /*
   and read the value string
   check for quote mark if needed
 */

    quotewarning = 0;
    start = lexer->lexsize;
    c = '\0';

    for (;;)
    {
        lastc = c;  /* track last character */
        c = TY_(ReadChar)(doc->docIn);

        if (c == EndOfStream)
        {
            TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_END_OF_FILE_ATTR );
            TY_(UngetChar)(c, doc->docIn);
            break;
        }

        if (delim == (tmbchar)0)
        {
            if (c == '>')
            {
                TY_(UngetChar)(c, doc->docIn);
                break;
            }

            if (c == '"' || c == '\'')
            {
                uint q = c;

                /* handle <input onclick=s("btn1")> and <a title=foo""">...</a> */
                /* this doesn't handle <a title=foo"/> which browsers treat as  */
                /* 'foo"/' nor  <a title=foo" /> which browser treat as 'foo"'  */
                
                c = TY_(ReadChar)(doc->docIn);
                if (c == '>')
                {
                    TY_(AddCharToLexer)(lexer, q);
                    TY_(UngetChar)(c, doc->docIn);
                    break;
                }
                else
                {
                    TY_(UngetChar)(c, doc->docIn);
                    c = q;
                }
            }

            if (c == '<')
            {
                TY_(UngetChar)(c, doc->docIn);
                c = '>';
                TY_(UngetChar)(c, doc->docIn);
                TY_(ReportAttrError)( doc, lexer->token, NULL, UNEXPECTED_GT );
                break;
            }

            /*
             For cases like <br clear=all/> need to avoid treating /> as
             part of the attribute value, however care is needed to avoid
             so treating <a href=http://www.acme.com/> in this way, which
             would map the <a> tag to <a href="http://www.acme.com"/>
            */
            if (c == '/')
            {
                /* peek ahead in case of /> */
                c = TY_(ReadChar)(doc->docIn);

                if ( c == '>' && !TY_(IsUrl)(doc, name) )
                {
                    *isempty = yes;
                    TY_(UngetChar)(c, doc->docIn);
                    break;
                }

                /* unget peeked character */
                TY_(UngetChar)(c, doc->docIn);
                c = '/';
            }
        }
        else  /* delim is '\'' or '"' */
        {
            if (c == delim)
                break;

            if (c == '\n' || c == '<' || c == '>')
                ++quotewarning;

            if (c == '>')
                seen_gt = yes;
        }

        if (c == '&')
        {
            TY_(AddCharToLexer)(lexer, c);
            ParseEntity( doc, IgnoreWhitespace );
            if (lexer->lexbuf[lexer->lexsize - 1] == '\n' && munge)
                ChangeChar(lexer, ' ');
            continue;
        }

        /*
         kludge for JavaScript attribute values
         with line continuations in string literals
        */
        if (c == '\\')
        {
            c = TY_(ReadChar)(doc->docIn);

            if (c != '\n')
            {
                TY_(UngetChar)(c, doc->docIn);
                c = '\\';
            }
        }

        if (TY_(IsWhite)(c))
        {
            if ( delim == 0 )
                break;

            if (munge)
            {
                /* discard line breaks in quoted URLs */ 
                /* #438650 - fix by Randy Waki */
                if ( c == '\n' && TY_(IsUrl)(doc, name) )
                {
                    /* warn that we discard this newline */
                    TY_(ReportAttrError)( doc, lexer->token, NULL, NEWLINE_IN_URI);
                    continue;
                }
                
                c = ' ';

                if (lastc == ' ')
                {
                    if (TY_(IsUrl)(doc, name) )
                        TY_(ReportAttrError)( doc, lexer->token, NULL, WHITE_IN_URI);
                    continue;
                }
            }
        }
        else if (foldCase && TY_(IsUpper)(c))
            c = TY_(ToLower)(c);

        TY_(AddCharToLexer)(lexer, c);
    }

    if (quotewarning > 10 && seen_gt && munge)
    {
        /*
           there is almost certainly a missing trailing quote mark
           as we have see too many newlines, < or > characters.

           an exception is made for Javascript attributes and the
           javascript URL scheme which may legitimately include < and >,
           and for attributes starting with "<xml " as generated by
           Microsoft Office.
        */
        if ( !TY_(IsScript)(doc, name) &&
             !(TY_(IsUrl)(doc, name) && TY_(tmbstrncmp)(lexer->lexbuf+start, "javascript:", 11) == 0) &&
             !(TY_(tmbstrncmp)(lexer->lexbuf+start, "<xml ", 5) == 0)
           )
            TY_(Report)( doc, NULL, NULL, SUSPECTED_MISSING_QUOTE ); 
    }

    len = lexer->lexsize - start;
    lexer->lexsize = start;


    if (len > 0 || delim)
    {
        /* ignore leading and trailing white space for all but title, alt, value */
        /* and prompts attributes unless --literal-attributes is set to yes      */
        /* #994841 - Whitespace is removed from value attributes                 */

        /* Issue #217 - Also only if/while (len > 0) - MUST NEVER GO NEGATIVE! */
        if ((len > 0) && munge &&
            TY_(tmbstrcasecmp)(name, "alt") &&
            TY_(tmbstrcasecmp)(name, "title") &&
            TY_(tmbstrcasecmp)(name, "value") &&
            TY_(tmbstrcasecmp)(name, "prompt"))
        {
            while (TY_(IsWhite)(lexer->lexbuf[start+len-1]) && (len > 0))
                --len;

            /* Issue #497 - Fix leading space trimming */
            while (TY_(IsWhite)(lexer->lexbuf[start]) && (len > 0))
            {
                ++start;
                --len;
            }
        }

        value = TY_(tmbstrndup)(doc->allocator, lexer->lexbuf + start, len);
    }
    else
        value = NULL;

    /* note delimiter if given */
    *pdelim = delim;

    return value;
}